

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList *
parserAddExprIdListTerm(Parse *pParse,ExprList *pPrior,Token *pIdToken,int hasCollate,int sortOrder)

{
  ExprList *pList;
  
  pList = sqlite3ExprListAppend(pParse,pPrior,(Expr *)0x0);
  if ((sortOrder != -1 || hasCollate != 0) && ((pParse->db->init).busy == '\0')) {
    sqlite3ErrorMsg(pParse,"syntax error after column name \"%.*s\"",(ulong)pIdToken->n,pIdToken->z)
    ;
  }
  sqlite3ExprListSetName(pParse,pList,pIdToken,1);
  return pList;
}

Assistant:

static ExprList *parserAddExprIdListTerm(
    Parse *pParse,
    ExprList *pPrior,
    Token *pIdToken,
    int hasCollate,
    int sortOrder
  ){
    ExprList *p = sqlite3ExprListAppend(pParse, pPrior, 0);
    if( (hasCollate || sortOrder!=SQLITE_SO_UNDEFINED)
        && pParse->db->init.busy==0
    ){
      sqlite3ErrorMsg(pParse, "syntax error after column name \"%.*s\"",
                         pIdToken->n, pIdToken->z);
    }
    sqlite3ExprListSetName(pParse, p, pIdToken, 1);
    return p;
  }